

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::TransactionController::CreateSignatureHash
          (TransactionController *this,Txid *txid,uint32_t vout,Pubkey *pubkey,
          SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined4 uVar1;
  Script *this_00;
  uint in_EDX;
  long in_RSI;
  ByteData *in_RDI;
  SigHashType *in_R9;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  ByteData256 sighash;
  uint32_t txin_index;
  Script script;
  vector local_d8 [28];
  SigHashType local_bc [12];
  undefined1 local_b0 [24];
  undefined1 local_98 [44];
  undefined4 local_6c;
  Pubkey local_68 [3];
  uint local_18;
  
  local_18 = in_EDX;
  cfd::core::ScriptUtil::CreateP2pkhLockingScript(local_68);
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)(in_RSI + 0x10),local_18);
  this_00 = (Script *)(in_RSI + 0x10);
  local_6c = uVar1;
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_bc,in_R9);
  cfd::core::Transaction::GetSignatureHash
            (local_98,this_00,uVar1,local_b0,local_bc,in_stack_00000008,in_stack_00000010);
  core::ByteData::~ByteData((ByteData *)0x3b4a15);
  cfd::core::ByteData256::GetBytes();
  cfd::core::ByteData::ByteData(in_RDI,local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_R9);
  core::ByteData256::~ByteData256((ByteData256 *)0x3b4a51);
  core::Script::~Script(this_00);
  return in_RDI;
}

Assistant:

ByteData TransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetSignatureHash(
      txin_index, script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}